

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoder__full_decode_and_uninit
                    (ma_decoder *pDecoder,ma_decoder_config *pConfigOut,ma_uint64 *pFrameCountOut,
                    void **ppPCMFramesOut)

{
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_void_ptr_void_ptr *p_Var2;
  ma_uint32 mVar3;
  ma_result mVar4;
  void *pvVar5;
  ma_uint64 mVar6;
  void *pvVar7;
  ma_uint64 mVar8;
  ulong uVar9;
  ulong frameCount;
  ma_uint64 framesJustRead;
  ulong local_38;
  
  uVar9 = (ulong)(*(int *)(&DAT_0017b4a0 + (ulong)pDecoder->outputFormat * 4) *
                 pDecoder->outputChannels);
  mVar6 = 0;
  pvVar7 = (void *)0x0;
  mVar8 = 0;
  do {
    pvVar5 = pvVar7;
    if (mVar8 == mVar6) {
      p_Var1 = (pDecoder->allocationCallbacks).onRealloc;
      if (p_Var1 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
LAB_00151852:
        if ((pvVar7 != (void *)0x0) &&
           (p_Var2 = (pDecoder->allocationCallbacks).onFree,
           p_Var2 != (_func_void_void_ptr_void_ptr *)0x0)) {
          (*p_Var2)(pvVar7,(pDecoder->allocationCallbacks).pUserData);
        }
        return MA_OUT_OF_MEMORY;
      }
      mVar6 = mVar6 * 2;
      if (mVar6 == 0) {
        mVar6 = 0x1000;
      }
      pvVar5 = (*p_Var1)(pvVar7,mVar6 * uVar9,(pDecoder->allocationCallbacks).pUserData);
      if (pvVar5 == (void *)0x0) goto LAB_00151852;
    }
    pvVar7 = pvVar5;
    frameCount = mVar6 - mVar8;
    mVar4 = ma_decoder_read_pcm_frames
                      (pDecoder,(void *)(mVar8 * uVar9 + (long)pvVar7),frameCount,&local_38);
    mVar8 = mVar8 + local_38;
    if ((mVar4 != MA_SUCCESS) || (local_38 < frameCount)) {
      if (pConfigOut != (ma_decoder_config *)0x0) {
        mVar3 = pDecoder->outputChannels;
        pConfigOut->format = pDecoder->outputFormat;
        pConfigOut->channels = mVar3;
        pConfigOut->sampleRate = pDecoder->outputSampleRate;
      }
      if (ppPCMFramesOut == (void **)0x0) {
        if ((pvVar7 != (void *)0x0) &&
           (p_Var2 = (pDecoder->allocationCallbacks).onFree,
           p_Var2 != (_func_void_void_ptr_void_ptr *)0x0)) {
          (*p_Var2)(pvVar7,(pDecoder->allocationCallbacks).pUserData);
        }
      }
      else {
        *ppPCMFramesOut = pvVar7;
      }
      if (pFrameCountOut != (ma_uint64 *)0x0) {
        *pFrameCountOut = mVar8;
      }
      ma_decoder_uninit(pDecoder);
      return MA_SUCCESS;
    }
  } while( true );
}

Assistant:

static ma_result ma_decoder__full_decode_and_uninit(ma_decoder* pDecoder, ma_decoder_config* pConfigOut, ma_uint64* pFrameCountOut, void** ppPCMFramesOut)
{
    ma_result result;
    ma_uint64 totalFrameCount;
    ma_uint64 bpf;
    ma_uint64 dataCapInFrames;
    void* pPCMFramesOut;

    MA_ASSERT(pDecoder != NULL);

    totalFrameCount = 0;
    bpf = ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels);

    /* The frame count is unknown until we try reading. Thus, we just run in a loop. */
    dataCapInFrames = 0;
    pPCMFramesOut = NULL;
    for (;;) {
        ma_uint64 frameCountToTryReading;
        ma_uint64 framesJustRead;

        /* Make room if there's not enough. */
        if (totalFrameCount == dataCapInFrames) {
            void* pNewPCMFramesOut;
            ma_uint64 newDataCapInFrames = dataCapInFrames*2;
            if (newDataCapInFrames == 0) {
                newDataCapInFrames = 4096;
            }

            if ((newDataCapInFrames * bpf) > MA_SIZE_MAX) {
                ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
                return MA_TOO_BIG;
            }

            pNewPCMFramesOut = (void*)ma_realloc(pPCMFramesOut, (size_t)(newDataCapInFrames * bpf), &pDecoder->allocationCallbacks);
            if (pNewPCMFramesOut == NULL) {
                ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
                return MA_OUT_OF_MEMORY;
            }

            dataCapInFrames = newDataCapInFrames;
            pPCMFramesOut = pNewPCMFramesOut;
        }

        frameCountToTryReading = dataCapInFrames - totalFrameCount;
        MA_ASSERT(frameCountToTryReading > 0);

        result = ma_decoder_read_pcm_frames(pDecoder, (ma_uint8*)pPCMFramesOut + (totalFrameCount * bpf), frameCountToTryReading, &framesJustRead);
        totalFrameCount += framesJustRead;

        if (result != MA_SUCCESS) {
            break;
        }

        if (framesJustRead < frameCountToTryReading) {
            break;
        }
    }


    if (pConfigOut != NULL) {
        pConfigOut->format     = pDecoder->outputFormat;
        pConfigOut->channels   = pDecoder->outputChannels;
        pConfigOut->sampleRate = pDecoder->outputSampleRate;
    }

    if (ppPCMFramesOut != NULL) {
        *ppPCMFramesOut = pPCMFramesOut;
    } else {
        ma_free(pPCMFramesOut, &pDecoder->allocationCallbacks);
    }

    if (pFrameCountOut != NULL) {
        *pFrameCountOut = totalFrameCount;
    }

    ma_decoder_uninit(pDecoder);
    return MA_SUCCESS;
}